

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames
               (ON_SimpleArray<const_ON_Font_*> *device_list)

{
  ON_Font *this;
  ON_wString font;
  bool bVar1;
  Stretch SVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ON_Font **ppOVar7;
  wchar_t *s;
  ON_wString local_120;
  ON_wString local_118;
  ON_wString local_110;
  ON_wString en_name;
  ON_wString loc_name;
  ON_wString suffix;
  Stretch stretch_1;
  ON_Font *f_1;
  uint j_1;
  int ds;
  Stretch stretch;
  uint j;
  bool bNeedToModifyFakeName;
  int delta_stretch;
  Stretch stretch0;
  int medium_stretch;
  uint quartet_candidate_count;
  ON_Font *f;
  ON_Font *f0_1;
  uint i_1;
  bool bSortAgain;
  ON_SimpleArray<const_ON_Font_*> quartet_candidates;
  ON_wString local_88;
  undefined1 local_80 [23];
  bool bEnglishFaceIsFamilyName;
  FontType local_61;
  undefined1 local_60 [7];
  bool bLocalFaceIsFamilyName;
  undefined1 local_58 [16];
  ON_wString fake_en_logfont_name;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  ON_wString fake_loc_logfont_name;
  ON_Font *f0;
  uint i;
  uint font_count;
  ON_SimpleArray<const_ON_Font_*> *device_list_local;
  
  uVar3 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount(device_list);
  for (f0._0_4_ = 0; (uint)f0 < uVar3; f0._0_4_ = (uint)f0 + 1) {
    ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[](device_list,(uint)f0);
    fake_loc_logfont_name.m_s = (wchar_t *)*ppOVar7;
    if ((ON_Font *)fake_loc_logfont_name.m_s != (ON_Font *)0x0) {
      ON_Font::FamilyName((ON_Font *)(local_38 + 8),(NameLocale)fake_loc_logfont_name.m_s);
      ON_Font::PostScriptName((ON_Font *)local_38,(NameLocale)fake_loc_logfont_name.m_s);
      ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                ((ON_Font *)local_28,(ON_wString *)(local_38 + 8),(ON_wString *)local_38);
      ON_wString::~ON_wString((ON_wString *)local_38);
      ON_wString::~ON_wString((ON_wString *)(local_38 + 8));
      bVar1 = ON_wString::IsEmpty((ON_wString *)local_28);
      if (bVar1) {
        fake_en_logfont_name.m_s._0_4_ = 4;
      }
      else {
        ON_Font::FamilyName((ON_Font *)local_58,(NameLocale)fake_loc_logfont_name.m_s);
        ON_Font::PostScriptName((ON_Font *)local_60,(NameLocale)fake_loc_logfont_name.m_s);
        ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames
                  ((ON_Font *)(local_58 + 8),(ON_wString *)local_58,(ON_wString *)local_60);
        ON_wString::~ON_wString((ON_wString *)local_60);
        ON_wString::~ON_wString((ON_wString *)local_58);
        bVar1 = ON_wString::IsEmpty((ON_wString *)(local_58 + 8));
        if (bVar1) {
          ON_wString::operator=((ON_wString *)(local_58 + 8),(ON_wString *)local_28);
        }
        else {
          bVar1 = ON_wString::EqualOrdinal((ON_wString *)local_28,(ON_wString *)(local_58 + 8),true)
          ;
          if (!bVar1) {
            ON_Font::FamilyName((ON_Font *)(local_80 + 0x10),(NameLocale)fake_loc_logfont_name.m_s);
            bVar1 = ON_wString::EqualOrdinal
                              ((ON_wString *)local_28,(ON_wString *)(local_80 + 0x10),true);
            ON_wString::~ON_wString((ON_wString *)(local_80 + 0x10));
            local_61 = bVar1;
            ON_Font::FamilyName((ON_Font *)local_80,(NameLocale)fake_loc_logfont_name.m_s);
            bVar1 = ON_wString::EqualOrdinal
                              ((ON_wString *)(local_58 + 8),(ON_wString *)local_80,true);
            ON_wString::~ON_wString((ON_wString *)local_80);
            local_80[0xf] = bVar1;
            if (((local_61 & ManagedFont) == Unset) || (bVar1)) {
              if ((bVar1) && ((local_61 & ManagedFont) == Unset)) {
                ON_wString::operator=((ON_wString *)(local_58 + 8),(ON_wString *)local_28);
              }
            }
            else {
              ON_wString::operator=((ON_wString *)local_28,(ON_wString *)(local_58 + 8));
            }
          }
        }
        font.m_s = fake_loc_logfont_name.m_s;
        ON_wString::ON_wString(&local_88,(ON_wString *)local_28);
        ON_wString::ON_wString
                  ((ON_wString *)&quartet_candidates.m_count,(ON_wString *)(local_58 + 8));
        Internal_SetFakeWindowsLogfontName
                  ((ON_Font *)font.m_s,&local_88,(ON_wString *)&quartet_candidates.m_count);
        ON_wString::~ON_wString((ON_wString *)&quartet_candidates.m_count);
        ON_wString::~ON_wString(&local_88);
        ON_wString::~ON_wString((ON_wString *)(local_58 + 8));
        fake_en_logfont_name.m_s._0_4_ = 0;
      }
      ON_wString::~ON_wString((ON_wString *)local_28);
    }
  }
  ON_SimpleArray<const_ON_Font_*>::QuickSort
            (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
  ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)&i_1,0x80);
  f0_1._7_1_ = 0;
  f0_1._0_4_ = 0;
  do {
    if (uVar3 <= (uint)f0_1) {
      if ((f0_1._7_1_ & 1) != 0) {
        ON_SimpleArray<const_ON_Font_*>::QuickSort
                  (device_list,ON_FontList::CompareFamilyAndWindowsLogfontName);
      }
      ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)&i_1);
      return;
    }
    ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[](device_list,(uint)f0_1);
    f = *ppOVar7;
    if (f != (ON_Font *)0x0) {
      ON_SimpleArray<const_ON_Font_*>::SetCount((ON_SimpleArray<const_ON_Font_*> *)&i_1,0);
      ON_SimpleArray<const_ON_Font_*>::Append((ON_SimpleArray<const_ON_Font_*> *)&i_1,&f);
      for (; (uint)f0_1 + 1 < uVar3; f0_1._0_4_ = (uint)f0_1 + 1) {
        ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[](device_list,(uint)f0_1 + 1);
        _medium_stretch = *ppOVar7;
        if ((_medium_stretch == (ON_Font *)0x0) ||
           (iVar4 = ON_FontList::CompareFamilyAndWindowsLogfontName(&f,(ON_Font **)&medium_stretch),
           iVar4 != 0)) break;
        ON_SimpleArray<const_ON_Font_*>::Append
                  ((ON_SimpleArray<const_ON_Font_*> *)&i_1,(ON_Font **)&medium_stretch);
      }
      uVar5 = ON_SimpleArray<const_ON_Font_*>::UnsignedCount
                        ((ON_SimpleArray<const_ON_Font_*> *)&i_1);
      if (1 < uVar5) {
        ON_SimpleArray<const_ON_Font_*>::QuickSort
                  ((ON_SimpleArray<const_ON_Font_*> *)&i_1,ON_FontList::CompareStretch);
        ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[]
                            ((ON_SimpleArray<const_ON_Font_*> *)&i_1,0);
        bNeedToModifyFakeName = (bool)ON_Font::FontStretch(*ppOVar7);
        j = 5 - bNeedToModifyFakeName;
        if ((int)j < 1) {
          j = -j;
        }
        bVar1 = false;
        for (ds = 0; (uint)ds < uVar5; ds = ds + 1) {
          ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[]
                              ((ON_SimpleArray<const_ON_Font_*> *)&i_1,ds);
          SVar2 = ON_Font::FontStretch(*ppOVar7);
          uVar6 = 5 - SVar2;
          if ((int)uVar6 < 1) {
            uVar6 = -uVar6;
          }
          if ((int)uVar6 < (int)j) {
            bVar1 = true;
            j = uVar6;
            bNeedToModifyFakeName = (bool)SVar2;
          }
        }
        if (bVar1) {
          for (f_1._4_4_ = 0; f_1._4_4_ < uVar5; f_1._4_4_ = f_1._4_4_ + 1) {
            ppOVar7 = ON_SimpleArray<const_ON_Font_*>::operator[]
                                ((ON_SimpleArray<const_ON_Font_*> *)&i_1,f_1._4_4_);
            this = *ppOVar7;
            SVar2 = ON_Font::FontStretch(this);
            if ((bool)SVar2 != bNeedToModifyFakeName) {
              ON_wString::ON_wString(&loc_name,L" (");
              s = ON_Font::StretchToWideString(SVar2);
              ON_wString::operator+=(&loc_name,s);
              iVar4 = ON_wString::Length(&loc_name);
              if (iVar4 < 3) {
                fake_en_logfont_name.m_s._0_4_ = 0xf;
              }
              else {
                ON_wString::operator+=(&loc_name,L")");
                ON_wString::operator+(&en_name,&this->m_loc_windows_logfont_name);
                ON_wString::operator+(&local_110,&this->m_en_windows_logfont_name);
                ON_wString::ON_wString(&local_118,&en_name);
                ON_wString::ON_wString(&local_120,&local_110);
                Internal_SetFakeWindowsLogfontName(this,&local_118,&local_120);
                ON_wString::~ON_wString(&local_120);
                ON_wString::~ON_wString(&local_118);
                f0_1._7_1_ = 1;
                ON_wString::~ON_wString(&local_110);
                ON_wString::~ON_wString(&en_name);
                fake_en_logfont_name.m_s._0_4_ = 0;
              }
              ON_wString::~ON_wString(&loc_name);
            }
          }
        }
      }
    }
    f0_1._0_4_ = (uint)f0_1 + 1;
  } while( true );
}

Assistant:

void ON_ManagedFonts::Internal_SetFakeWindowsLogfontNames(
  ON_SimpleArray<const ON_Font*>& device_list
)
{
  // Windows divides font families (which can have many faces) 
  // into LOGFONT subsets identified by a logfont name.
  // A LOGFONT subset can have at most 4 faces and typically 
  // they are regular/bold/italic/bold-italic variations of 
  // a face and all have matching stretch.
  //
  // This all goes back to the 1970's and early user interfaces
  // that selected fonts based on a name, bold=true/false, italic=true/false
  // style inteface. This type of archaic font selection interface is way 
  // too simple to accomodate the rich font families are currently in use.
  // Newer font families can have dozens of faces with severeal weights,
  // several widths, and an upright and italic version of each of these.
  // However, that does not prevent applications like Rhino 6/7 
  // from attempting to use the inadequate and archic bold/italic font
  // selection interface to select a font from a rich list of modern fonts.
  //
  // This function is used on non Windows platforms to partition 
  // the installed font families into subsets with the same
  // width and set a unique fake LOGFONT name. Later sorting will
  // choose up to four faces from each subset to use as the 
  // regular/bold/italic/bold-italic representatives.

  // Assign a fake logfont name.
  const unsigned int font_count = device_list.UnsignedCount();
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    ON_wString fake_loc_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::LocalizedFirst),
      f0->PostScriptName(ON_Font::NameLocale::LocalizedFirst)
    );
    if (fake_loc_logfont_name.IsEmpty())
      continue;
    ON_wString fake_en_logfont_name = ON_Font::FakeWindowsLogfontNameFromFamilyAndPostScriptNames(
      f0->FamilyName(ON_Font::NameLocale::English),
      f0->PostScriptName(ON_Font::NameLocale::English)
    );
    if (fake_en_logfont_name.IsEmpty())
      fake_en_logfont_name = fake_loc_logfont_name;
    else if (false == fake_loc_logfont_name.EqualOrdinal(fake_en_logfont_name, true))
    {
      const bool bLocalFaceIsFamilyName = fake_loc_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::LocalizedFirst), true);
      const bool bEnglishFaceIsFamilyName = fake_en_logfont_name.EqualOrdinal(f0->FamilyName(ON_Font::NameLocale::English), true);
      if (bLocalFaceIsFamilyName && false == bEnglishFaceIsFamilyName)
        fake_loc_logfont_name = fake_en_logfont_name;
      else if (bEnglishFaceIsFamilyName && false == bLocalFaceIsFamilyName)
        fake_en_logfont_name = fake_loc_logfont_name;
    }

    ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(
      f0,
      fake_loc_logfont_name,
      fake_en_logfont_name
    );
  }

  // Sort device_list by font family and current fake LOGFONT name
  device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);
  ON_SimpleArray<const ON_Font*> quartet_candidates(128);
  bool bSortAgain = false;
  for (unsigned int i = 0; i < font_count; ++i)
  {
    const ON_Font* f0 = device_list[i];
    if (nullptr == f0)
      continue;

    quartet_candidates.SetCount(0);
    quartet_candidates.Append(f0);
    while( (i + 1) < font_count )
    {
      const ON_Font* f = device_list[i + 1];
      if (nullptr == f || 0 != ON_FontList::CompareFamilyAndWindowsLogfontName(&f0, &f))
        break;
      quartet_candidates.Append(f);
      ++i;
    }
    const unsigned int quartet_candidate_count = quartet_candidates.UnsignedCount();
    if (quartet_candidate_count < 2)
      continue;

    // members in a fake LOGFONT quartet should have the same stretch
    quartet_candidates.QuickSort(ON_FontList::CompareStretch);

    // See which subset of family gets to use the family name as 
    // the fake logfont name.
    const int medium_stretch = (int)((unsigned)(ON_Font::Stretch::Medium));
    ON_Font::Stretch stretch0 = quartet_candidates[0]->FontStretch();
    int delta_stretch = abs(medium_stretch - ((int)((unsigned)(stretch0))));
    bool bNeedToModifyFakeName = false;
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font::Stretch stretch = quartet_candidates[j]->FontStretch();
      int ds = abs(medium_stretch - ((int)((unsigned)(stretch))));
      if (ds < delta_stretch)
      {
        stretch0 = stretch;
        delta_stretch = ds;
        bNeedToModifyFakeName = true;
      }
    }

    if (false == bNeedToModifyFakeName)
      continue; // we cannot use stretch to distinguish between family members

    // If a family member's stretch is not stretch0, modify its names.
    for (unsigned int j = 0; j < quartet_candidate_count; ++j)
    {
      const ON_Font* f = quartet_candidates[j];
      const ON_Font::Stretch stretch = f->FontStretch();
      if (stretch == stretch0)
        continue;
      ON_wString suffix = L" (";
      suffix += ON_Font::StretchToWideString(stretch);
      if (suffix.Length() < 3)
        continue;
      suffix += L")";
      const ON_wString loc_name = f->m_loc_windows_logfont_name+suffix;
      const ON_wString en_name = f->m_en_windows_logfont_name+suffix;
      ON_ManagedFonts::Internal_SetFakeWindowsLogfontName(f,loc_name,en_name);
      bSortAgain = true;
    }
  }

  if (bSortAgain)
    device_list.QuickSort(ON_FontList::CompareFamilyAndWindowsLogfontName);

}